

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelExtractor.h
# Opt level: O1

void __thiscall
hiberlite::ExtractModel::notifyInitWalk<hiberlite::AVisitor<hiberlite::ExtractModel>>
          (ExtractModel *this,AVisitor<hiberlite::ExtractModel> *av)

{
  pointer pcVar1;
  mapped_type *this_00;
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  key_type local_e0;
  undefined1 *local_c0;
  long local_b8;
  undefined1 local_b0 [16];
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  int local_80;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  int local_38;
  
  pcVar1 = (av->scope)._table._M_dataplus._M_p;
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar1,pcVar1 + (av->scope)._table._M_string_length);
  pcVar1 = (av->scope)._prefix._M_dataplus._M_p;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar1,pcVar1 + (av->scope)._prefix._M_string_length);
  local_38 = (av->scope).prefix_depth;
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char*>((string *)local_100,local_78,local_78 + local_70);
  pcVar1 = (av->scope)._table._M_dataplus._M_p;
  local_c0 = local_b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar1,pcVar1 + (av->scope)._table._M_string_length);
  pcVar1 = (av->scope)._prefix._M_dataplus._M_p;
  local_a0[0] = local_90;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a0,pcVar1,pcVar1 + (av->scope)._prefix._M_string_length);
  local_80 = (av->scope).prefix_depth;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_e0,local_c0,local_c0 + local_b8);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>_>
                          *)this,&local_e0);
  std::__cxx11::string::operator=((string *)this_00,(string *)local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0]);
  }
  if (local_c0 != local_b0) {
    operator_delete(local_c0);
  }
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0]);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  return;
}

Assistant:

inline void notifyInitWalk(AV& av){
			model[av.getScope().table()].name=av.getScope().table();
		}